

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::printDisplayLine
          (SPxSolverBase<double> *this,bool force,bool forceHead)

{
  Verbosity VVar1;
  Type TVar2;
  _Setprecision _Var3;
  SLinSolver<double> *pSVar4;
  byte in_DL;
  byte in_SIL;
  time_t *__timer;
  SPxSolverBase<double> *in_RDI;
  Verbosity old_verbosity;
  SPxOut *in_stack_fffffffffffffef8;
  SPxOut *in_stack_ffffffffffffff00;
  undefined4 local_14;
  Verbosity local_10;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = in_DL & 1;
  if ((in_RDI->spxout != (SPxOut *)0x0) &&
     (VVar1 = SPxOut::getVerbosity(in_RDI->spxout), 2 < (int)VVar1)) {
    local_10 = SPxOut::getVerbosity(in_RDI->spxout);
    local_14 = 3;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_14);
    if (((local_a & 1) != 0) || (in_RDI->displayLine % (in_RDI->displayFreq * 0x1e) == 0)) {
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      if (-1 < in_RDI->printBasisMetric) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
      soplex::operator<<(in_stack_ffffffffffffff00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
    }
    if ((((local_9 & 1) != 0) || (in_RDI->displayLine % in_RDI->displayFreq == 0)) &&
       ((local_a & 1) == 0)) {
      TVar2 = type(in_RDI);
      if (TVar2 == LEAVE) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
      else {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      }
      soplex::operator<<(in_stack_ffffffffffffff00,
                         (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
      std::setw(7);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setw)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      _Var3 = std::setprecision(1);
      __timer = (time_t *)(ulong)(uint)_Var3._M_n;
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      time(in_RDI,__timer);
      soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,
                         (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
      std::setprecision(2);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      std::setw(8);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setw)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      SPxBasisBase<double>::iteration(&in_RDI->super_SPxBasisBase<double>);
      soplex::operator<<(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::setw(5);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setw)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      pSVar4 = slinSolver(in_RDI);
      (*pSVar4->_vptr_SLinSolver[0xb])();
      soplex::operator<<(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6d])();
      soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::setw(8);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setw)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
      std::setprecision(8);
      soplex::operator<<(in_stack_fffffffffffffef8,
                         (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])();
      soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      if (in_RDI->printBasisMetric == 0) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        soplex::operator<<(in_stack_ffffffffffffff00,
                           (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
        std::setprecision(2);
        soplex::operator<<(in_stack_fffffffffffffef8,
                           (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(in_RDI,0);
        soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      }
      if (in_RDI->printBasisMetric == 1) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        soplex::operator<<(in_stack_ffffffffffffff00,
                           (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
        std::setprecision(2);
        soplex::operator<<(in_stack_fffffffffffffef8,
                           (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(in_RDI,1);
        soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      }
      if (in_RDI->printBasisMetric == 2) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        soplex::operator<<(in_stack_ffffffffffffff00,
                           (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
        std::setprecision(2);
        soplex::operator<<(in_stack_fffffffffffffef8,
                           (_Setprecision)(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x68])(in_RDI,2);
        soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      }
      if (in_RDI->printBasisMetric == 3) {
        soplex::operator<<(in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        in_stack_fffffffffffffef8 =
             soplex::operator<<(in_stack_ffffffffffffff00,
                                (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffef8);
        _Var3._M_n = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
        std::setprecision(2);
        in_stack_ffffffffffffff00 = soplex::operator<<(in_stack_fffffffffffffef8,_Var3);
        basis(in_RDI);
        SPxBasisBase<double>::getEstimatedCondition((SPxBasisBase<double> *)0x216d3b);
        soplex::operator<<(in_stack_ffffffffffffff00,(double)in_stack_fffffffffffffef8);
      }
      soplex::operator<<(in_stack_ffffffffffffff00,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffef8);
    }
    in_RDI->displayLine = in_RDI->displayLine + 1;
    (*in_RDI->spxout->_vptr_SPxOut[2])(in_RDI->spxout,&local_10);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }